

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

void __thiscall Namespace<true>::AddFeature(Namespace<true> *this,vw *all,char *str)

{
  features *pfVar1;
  uint64_t uVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  substring sVar3;
  allocator local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  char *str_local;
  char *local_38;
  long local_30;
  
  pfVar1 = this->ftrs;
  str_local = str;
  std::__cxx11::string::string((string *)&local_38,str,local_50);
  sVar3.end = local_38 + local_30;
  sVar3.begin = local_38;
  uVar2 = (*all->p->hasher)(sVar3,this->namespace_hash);
  features::push_back(pfVar1,1.0,uVar2 & all->parse_mask);
  std::__cxx11::string::~string((string *)&local_38);
  this->feature_count = this->feature_count + 1;
  pfVar1 = this->ftrs;
  this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x40);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*&,_const_char_*&,_true>(this_00,&this->name,&str_local);
  std::__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
            ((__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)local_50,this_00);
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(&pfVar1->space_names,
              (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  return;
}

Assistant:

void AddFeature(vw* all, const char* str)
  {
    ftrs->push_back(1., VW::hash_feature(*all, str, namespace_hash));
    feature_count++;

    if (audit)
      ftrs->space_names.push_back(audit_strings_ptr(new audit_strings(name, str)));
  }